

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stack.cpp
# Opt level: O3

bool test5(void)

{
  int iVar1;
  bool bVar2;
  iterator iVar3;
  ostream *poVar4;
  long *plVar5;
  int local_2c;
  int *local_28;
  iterator iStack_20;
  int *local_18;
  
  local_28 = (int *)0x0;
  iStack_20._M_current = (int *)0x0;
  local_18 = (int *)0x0;
  local_2c = 0;
  do {
    if (iStack_20._M_current == local_18) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_28,iStack_20,&local_2c);
    }
    else {
      *iStack_20._M_current = local_2c;
      iStack_20._M_current = iStack_20._M_current + 1;
    }
    iVar1 = local_2c + 1;
    bVar2 = local_2c < 999;
    local_2c = iVar1;
  } while (bVar2);
  iVar3._M_current = iStack_20._M_current + -500;
  if (local_28 != iStack_20._M_current + -500) {
    iVar3._M_current =
         iStack_20._M_current +
         (-0x7d4 - ((long)iStack_20._M_current + (-0x7d4 - (long)local_28) & 0xfffffffffffffffcU));
  }
  iStack_20._M_current = iVar3._M_current;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  plVar5 = (long *)std::ostream::operator<<(poVar4,_DAT_fffffffffffffffc);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_28 != (int *)0x0) {
    operator_delete(local_28,(long)local_18 - (long)local_28);
  }
  return true;
}

Assistant:

bool test5() {
  int n = 1000;
  Stack s1;
  for (int i = 0;i < n;i++) { s1.push(i); }
  for (int i = 0;i < n/2;i++) { s1.pop(); }
  Stack s2 = s1;
  while (!s1.empty()) { s1.pop(); }
  Stack s3(s1);

  cout << s1.size() << " " << s1.empty() << endl;
  cout << s2.size() << " " << s2.empty() << s2.top() << endl;
  cout << s3.size() << " " << s3.empty() << endl;
  return true;
}